

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void internal_insert_commands_before_after(Am_Object *cmd,bool before)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ostream *poVar6;
  Am_Object new_cmd;
  Am_Object execute_command;
  Am_Object this_cmd;
  Am_Value_List orig_cmds;
  Am_Object script_window;
  Am_Value_List sel_list;
  Am_Object undo_db;
  Am_Object scroll_menu;
  Am_Value_List original_command_list;
  Am_Value_List new_cmds;
  Am_Object local_38;
  
  Am_Object::Get_Object((Am_Object *)&sel_list,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&sel_list);
  Am_Object::~Am_Object((Am_Object *)&sel_list);
  pAVar4 = Am_Object::Get(&script_window,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&scroll_menu,pAVar4);
  pAVar4 = Am_Object::Get(&scroll_menu,0x169,0);
  Am_Value_List::Am_Value_List(&sel_list,pAVar4);
  pAVar4 = Am_Object::Get(&script_window,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&undo_db,pAVar4);
  Am_Object::Get_Object((Am_Object *)&orig_cmds,(Am_Slot_Key)&undo_db,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar4 = Am_Object::Get((Am_Object *)&orig_cmds,0x169,0);
  Am_Value_List::Am_Value_List(&new_cmds,pAVar4);
  Am_Object::~Am_Object((Am_Object *)&orig_cmds);
  pAVar4 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&execute_command,pAVar4);
  pAVar4 = Am_Object::Get(&execute_command,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&orig_cmds,pAVar4);
  pAVar4 = Am_Object::Get(&execute_command,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&original_command_list,pAVar4);
  Am_Value_List::Copy((Am_Value_List *)&this_cmd);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&this_cmd);
  Am_Object::Set(cmd,0x16c,pAVar5,0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&this_cmd);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  Am_Value_List::Copy((Am_Value_List *)&this_cmd);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&this_cmd);
  Am_Object::Set(cmd,AVar1,pAVar5,1);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&this_cmd);
  if (before) {
    bVar2 = Am_Value_List::Valid(&sel_list);
    if (!bVar2) {
      Am_Value_List::Start(&orig_cmds);
      goto LAB_002214a3;
    }
    pAVar4 = Am_Value_List::Get_First(&sel_list);
    Am_Object::Am_Object(&this_cmd,pAVar4);
    pAVar4 = Am_Object::Get(&this_cmd,0xc5,0);
    Am_Object::Am_Object(&new_cmd,pAVar4);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&new_cmd);
    bVar2 = Am_Value_List::Start_Member(&orig_cmds,pAVar5);
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar6 = std::operator<<(poVar6,"Lost insert_before cmd ");
      poVar6 = operator<<(poVar6,&new_cmd);
      poVar6 = std::operator<<(poVar6," from list ");
      poVar6 = operator<<(poVar6,&orig_cmds);
      poVar6 = std::operator<<(poVar6," of ");
      poVar6 = operator<<(poVar6,&execute_command);
      std::endl<char,std::char_traits<char>>(poVar6);
      Am_Error();
    }
  }
  else {
    bVar2 = Am_Value_List::Valid(&sel_list);
    if (!bVar2) {
      Am_Value_List::End(&orig_cmds);
      goto LAB_002214a3;
    }
    uVar3 = Am_Value_List::Length(&sel_list);
    pAVar4 = Am_Value_List::Get_Nth(&sel_list,uVar3 - 1);
    Am_Object::Am_Object(&this_cmd,pAVar4);
    pAVar4 = Am_Object::Get(&this_cmd,0xc5,0);
    Am_Object::Am_Object(&new_cmd,pAVar4);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&new_cmd);
    bVar2 = Am_Value_List::Start_Member(&orig_cmds,pAVar5);
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar6 = std::operator<<(poVar6,"Lost insert_after cmd ");
      poVar6 = operator<<(poVar6,&new_cmd);
      poVar6 = std::operator<<(poVar6," from list ");
      poVar6 = operator<<(poVar6,&orig_cmds);
      poVar6 = std::operator<<(poVar6," of ");
      poVar6 = operator<<(poVar6,&execute_command);
      std::endl<char,std::char_traits<char>>(poVar6);
      Am_Error();
    }
    Am_Value_List::Next(&orig_cmds);
  }
  Am_Object::~Am_Object(&new_cmd);
  Am_Object::~Am_Object(&this_cmd);
LAB_002214a3:
  this_cmd.data = (Am_Object_Data *)0x0;
  new_cmd.data = (Am_Object_Data *)0x0;
  Am_Value_List::End(&new_cmds);
  while( true ) {
    bVar2 = Am_Value_List::First(&new_cmds);
    if (bVar2) break;
    pAVar4 = Am_Value_List::Get(&new_cmds);
    Am_Object::operator=(&this_cmd,pAVar4);
    if (am_sdebug == true) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\n adding command ");
      poVar6 = operator<<(poVar6,&this_cmd);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::ostream::flush();
    }
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&this_cmd);
    Am_Value_List::Add(&original_command_list,pAVar5,Am_TAIL,true);
    Am_Object::Copy_Value_Only(&local_38,(char *)&this_cmd);
    Am_Object::operator=(&new_cmd,&local_38);
    Am_Object::~Am_Object(&local_38);
    Am_Object::Set(&new_cmd,0x154,-10,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&new_cmd);
    Am_Value_List::Insert(&orig_cmds,pAVar5,Am_BEFORE,true);
    Am_Value_List::Prev(&new_cmds);
  }
  renumber_script_commands(&orig_cmds);
  AVar1 = Am_COMMANDS_PROTOTYPES;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&orig_cmds);
  Am_Object::Set(&execute_command,AVar1,pAVar5,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&orig_cmds);
  Am_Object::Set(&execute_command,AVar1,pAVar5,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&original_command_list);
  Am_Object::Set(&execute_command,AVar1,pAVar5,0);
  am_set_commands_into_script_window(&script_window,&execute_command);
  Am_Object::~Am_Object(&new_cmd);
  Am_Object::~Am_Object(&this_cmd);
  Am_Value_List::~Am_Value_List(&original_command_list);
  Am_Value_List::~Am_Value_List(&orig_cmds);
  Am_Object::~Am_Object(&execute_command);
  Am_Value_List::~Am_Value_List(&new_cmds);
  Am_Object::~Am_Object(&undo_db);
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&scroll_menu);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

void
internal_insert_commands_before_after(Am_Object &cmd, bool before)
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Value_List new_cmds =
      undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds.Copy());
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list.Copy(),
          Am_OK_IF_NOT_THERE);

  if (before) {
    if (sel_list.Valid()) {
      Am_Object first_line = sel_list.Get_First();
      Am_Object insert_before = first_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_before))
        Am_ERROR("Lost insert_before cmd " << insert_before << " from list "
                                           << orig_cmds << " of "
                                           << execute_command);
    } else
      orig_cmds.Start();
  } else {
    if (sel_list.Valid()) {
      Am_Object last_line = sel_list.Get_Nth(sel_list.Length() - 1);
      Am_Object insert_after = last_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_after))
        Am_ERROR("Lost insert_after cmd " << insert_after << " from list "
                                          << orig_cmds << " of "
                                          << execute_command);
      orig_cmds.Next();
    } else
      orig_cmds.End();
  }

  //here orig_cmds is set so can insert at the current element

  //commands come in backwards, swap them
  Am_Object this_cmd, new_cmd;
  for (new_cmds.End(); !new_cmds.First(); new_cmds.Prev()) {
    this_cmd = new_cmds.Get();
    if (am_sdebug)
      std::cout << "\n adding command " << this_cmd << std::endl << std::flush;
    original_command_list.Add(this_cmd);
    new_cmd = this_cmd.Copy_Value_Only();
    new_cmd.Set(Am_IMPLEMENTATION_PARENT, Am_IN_A_SCRIPT);
    orig_cmds.Insert(new_cmd, Am_BEFORE);
  }

  //now fix up the numbering
  renumber_script_commands(orig_cmds);

  execute_command.Set(Am_COMMANDS_PROTOTYPES, orig_cmds);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, orig_cmds);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}